

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-graph.cpp
# Opt level: O0

ggml_tensor * __thiscall llm_graph_context::build_inp_out_ids(llm_graph_context *this)

{
  undefined8 uVar1;
  pointer plVar2;
  ggml_tensor *pgVar3;
  pointer __u;
  llama_cparams *in_RDI;
  ggml_tensor **cur;
  __single_object inp;
  llm_graph_input_ptr *in_stack_ffffffffffffff98;
  llm_graph_result *in_stack_ffffffffffffffa0;
  llama_hparams *in_stack_ffffffffffffffc8;
  unique_ptr<llm_graph_input_i,_std::default_delete<llm_graph_input_i>_> local_30 [3];
  ggml_tensor **local_18;
  int local_10 [4];
  
  std::make_unique<llm_graph_input_out_ids,llama_hparams_const&,llama_cparams_const&,int_const&>
            (in_stack_ffffffffffffffc8,in_RDI,local_10);
  plVar2 = std::unique_ptr<llm_graph_input_out_ids,_std::default_delete<llm_graph_input_out_ids>_>::
           operator->((unique_ptr<llm_graph_input_out_ids,_std::default_delete<llm_graph_input_out_ids>_>
                       *)0x434a4b);
  local_18 = &plVar2->out_ids;
  uVar1._0_4_ = in_RDI[2].n_threads;
  uVar1._4_4_ = in_RDI[2].n_threads_batch;
  pgVar3 = (ggml_tensor *)
           ggml_new_tensor_1d(uVar1,0x1a,(long)*(int *)((long)&in_RDI[1].cb_eval_user_data + 4));
  *local_18 = pgVar3;
  ggml_set_input(*local_18);
  __u = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                  ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)0x434aa8)
  ;
  std::unique_ptr<llm_graph_input_i,std::default_delete<llm_graph_input_i>>::
  unique_ptr<llm_graph_input_out_ids,std::default_delete<llm_graph_input_out_ids>,void>
            (local_30,(unique_ptr<llm_graph_input_out_ids,_std::default_delete<llm_graph_input_out_ids>_>
                       *)__u);
  llm_graph_result::add_input(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  std::unique_ptr<llm_graph_input_i,_std::default_delete<llm_graph_input_i>_>::~unique_ptr
            ((unique_ptr<llm_graph_input_i,_std::default_delete<llm_graph_input_i>_> *)
             in_stack_ffffffffffffffa0);
  pgVar3 = *local_18;
  std::unique_ptr<llm_graph_input_out_ids,_std::default_delete<llm_graph_input_out_ids>_>::
  ~unique_ptr((unique_ptr<llm_graph_input_out_ids,_std::default_delete<llm_graph_input_out_ids>_> *)
              pgVar3);
  return pgVar3;
}

Assistant:

ggml_tensor * llm_graph_context::build_inp_out_ids() const {
    auto inp = std::make_unique<llm_graph_input_out_ids>(hparams, cparams, n_outputs);

    auto & cur = inp->out_ids;

    cur = ggml_new_tensor_1d(ctx0, GGML_TYPE_I32, n_outputs);
    ggml_set_input(cur);

    res->add_input(std::move(inp));

    return cur;
}